

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O0

float __thiscall
MetaCommand::GetValueAsFloat(MetaCommand *this,string *optionName,string *fieldName)

{
  bool bVar1;
  __type _Var2;
  ulong uVar3;
  char *__nptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  string *in_RSI;
  double dVar4;
  const_iterator itField;
  const_iterator it;
  string fieldname;
  vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_> *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
  local_70;
  Option *local_68;
  Option *local_60;
  __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
  local_58 [3];
  string local_40 [60];
  float local_4;
  
  __rhs = in_RDX;
  std::__cxx11::string::string(local_40,(string *)in_RDX);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    std::__cxx11::string::operator=(local_40,in_RSI);
  }
  local_60 = (Option *)
             std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::begin
                       ((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *)
                        in_stack_ffffffffffffff58);
  __gnu_cxx::
  __normal_iterator<MetaCommand::Option_const*,std::vector<MetaCommand::Option,std::allocator<MetaCommand::Option>>>
  ::__normal_iterator<MetaCommand::Option*>
            ((__normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
              *)in_RDX,
             (__normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
              *)in_stack_ffffffffffffff58);
  do {
    local_68 = (Option *)
               std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::end
                         ((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *)
                          in_stack_ffffffffffffff58);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                        *)in_RDX,
                       (__normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                        *)in_stack_ffffffffffffff58);
    if (!bVar1) {
      local_4 = 0.0;
LAB_00126a21:
      std::__cxx11::string::~string(local_40);
      return local_4;
    }
    __gnu_cxx::
    __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
    ::operator*(local_58);
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),__rhs);
    if (_Var2) {
      __gnu_cxx::
      __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
      ::operator*(local_58);
      local_70._M_current =
           (Field *)std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::begin
                              (in_stack_ffffffffffffff58);
      while( true ) {
        __gnu_cxx::
        __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
        ::operator*(local_58);
        std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::end
                  (in_stack_ffffffffffffff58);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                            *)in_RDX,
                           (__normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                            *)in_stack_ffffffffffffff58);
        if (!bVar1) break;
        __gnu_cxx::
        __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
        ::operator*(&local_70);
        _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),__rhs
                               );
        if (_Var2) {
          __gnu_cxx::
          __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
          ::operator*(&local_70);
          __nptr = (char *)std::__cxx11::string::c_str();
          dVar4 = atof(__nptr);
          local_4 = (float)dVar4;
          goto LAB_00126a21;
        }
        __gnu_cxx::
        __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
        ::operator++(&local_70);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
    ::operator++(local_58);
  } while( true );
}

Assistant:

float MetaCommand::GetValueAsFloat(METAIO_STL::string optionName,METAIO_STL::string fieldName)
{
  METAIO_STL::string fieldname = fieldName;
  if (fieldName.empty()) {
    fieldname = optionName;
  }

  OptionVector::const_iterator it = m_OptionVector.begin();
  while(it != m_OptionVector.end())
    {
    if((*it).name == optionName)
      {
      auto itField = (*it).fields.begin();
      while(itField != (*it).fields.end())
        {
        if((*itField).name == fieldname)
          {
          return (float)atof((*itField).value.c_str());
          }
        ++itField;
        }
      }
    ++it;
    }
  return 0;
}